

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::TestFileAccess(char *filename,TestFilePermissions permissions)

{
  bool bVar1;
  allocator local_31;
  string local_30;
  
  if (filename == (char *)0x0) {
    bVar1 = false;
  }
  else {
    std::__cxx11::string::string((string *)&local_30,filename,&local_31);
    bVar1 = TestFileAccess(&local_30,permissions);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return bVar1;
}

Assistant:

bool SystemTools::TestFileAccess(const char* filename,
                                 TestFilePermissions permissions)
{
  if(!filename)
    {
    return false;
    }
  return SystemTools::TestFileAccess(std::string(filename),
                                     permissions);
}